

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

LispPTR UFS_deletefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  ulong uVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  LispPTR local_2108;
  ulong local_2100;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  int rval;
  int len;
  stat sbuf;
  char fbuf [4096];
  char file [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lf_arrayp._4_4_ = pLVar2[2];
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lf_arrayp._4_4_ = pLVar2[2] << 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if ((int)(lf_arrayp._4_4_ + 1) < 0x1001) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_2108 = pLVar2[2];
      }
      else {
        local_2108 = 0x1000;
      }
      uVar3 = (ulong)(int)local_2108;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(sbuf.__glibc_reserved + 2);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < uVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        *(undefined1 *)((long)sbuf.__glibc_reserved + uVar3 + 0x10) = 0;
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(sbuf.__glibc_reserved + 2);
        for (local_2100 = 0; local_2100 < uVar3; local_2100 = local_2100 + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar1 = unixpathname((char *)(sbuf.__glibc_reserved + 2),fbuf + 0xff8,0,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = stat(fbuf + 0xff8,(stat *)&rval);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          args_local._4_4_ = 0;
        }
        else {
          if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
            alarm(TIMEOUT_TIME);
            do {
              piVar5 = __errno_location();
              *piVar5 = 0;
              lf_arrayp._0_4_ = rmdir(fbuf + 0xff8);
              bVar6 = false;
              if ((int)lf_arrayp == -1) {
                piVar5 = __errno_location();
                bVar6 = *piVar5 == 4;
              }
            } while (bVar6);
            alarm(0);
          }
          else {
            alarm(TIMEOUT_TIME);
            do {
              piVar5 = __errno_location();
              *piVar5 = 0;
              lf_arrayp._0_4_ = unlink(fbuf + 0xff8);
              bVar6 = false;
              if ((int)lf_arrayp == -1) {
                piVar5 = __errno_location();
                bVar6 = *piVar5 == 4;
              }
            } while (bVar6);
            alarm(0);
          }
          if ((int)lf_arrayp == -1) {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            args_local._4_4_ = 0;
          }
          else {
            args_local._4_4_ = 0x4c;
          }
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR UFS_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN];
  struct stat sbuf;
  int len, rval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[1]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);

#ifdef DOS
  if (unixpathname(fbuf, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, file, 0, 0) == 0) return (NIL);
#endif /* DOS */
  /* check if we're operating on directory or file */
  TIMEOUT(rval = stat(file, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  /*
   * On UNIX device, all we have to do is just to unlink the file
   * or directory
   */
  if (S_ISDIR(sbuf.st_mode)) {
    TIMEOUT(rval = rmdir(file));
  } else {
    TIMEOUT(rval = unlink(file));
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}